

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O2

void ssh2_channel_init(ssh2_channel *c)

{
  ssh2_connection_state *psVar1;
  uint uVar2;
  int iVar3;
  
  psVar1 = c->connlayer;
  c->sharectx = (ssh_sharing_connstate *)0x0;
  c->closes = 0;
  *(undefined4 *)((long)&c->closes + 3) = 0;
  iVar3 = 0x4000;
  if (psVar1->ssh_is_simple != false) {
    iVar3 = 0x7fffffff;
  }
  c->remlocwin = iVar3;
  c->locmaxwin = iVar3;
  c->locwindow = iVar3;
  c->chanreq_head = (outstanding_channel_request *)0x0;
  c->throttle_state = UNTHROTTLED;
  bufchain_init(&c->outbuffer);
  bufchain_init(&c->errbuffer);
  (c->sc).vt = &ssh2channel_vtable;
  (c->sc).cl = &psVar1->cl;
  uVar2 = alloc_channel_id_general(psVar1->channels,0xc);
  c->localid = uVar2;
  add234(psVar1->channels,c);
  return;
}

Assistant:

void ssh2_channel_init(struct ssh2_channel *c)
{
    struct ssh2_connection_state *s = c->connlayer;
    c->closes = 0;
    c->pending_eof = false;
    c->throttling_conn = false;
    c->throttled_by_backlog = false;
    c->sharectx = NULL;
    c->locwindow = c->locmaxwin = c->remlocwin =
        s->ssh_is_simple ? OUR_V2_BIGWIN : OUR_V2_WINSIZE;
    c->chanreq_head = NULL;
    c->throttle_state = UNTHROTTLED;
    bufchain_init(&c->outbuffer);
    bufchain_init(&c->errbuffer);
    c->sc.vt = &ssh2channel_vtable;
    c->sc.cl = &s->cl;
    c->localid = alloc_channel_id(s->channels, struct ssh2_channel);
    add234(s->channels, c);
}